

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

void __thiscall MP1Node::sendMembershipList(MP1Node *this,Address *to,MsgTypes msgType)

{
  Member *pMVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  MsgTypes *data;
  iterator __position;
  int size;
  byte *pbVar5;
  iterator entry;
  Address toAddr;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"start sendMembershipList ...");
  std::endl<char,std::char_traits<char>>(poVar3);
  pMVar1 = this->memberNode;
  __position._M_current =
       (pMVar1->memberList).super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  lVar4 = ((long)(pMVar1->memberList).
                 super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)__position._M_current) / 0x18;
  data = (MsgTypes *)malloc(lVar4 * 0xe + 0x12);
  *data = msgType;
  data[1] = *(MsgTypes *)(pMVar1->addr).addr;
  *(undefined2 *)(data + 2) = *(undefined2 *)((pMVar1->addr).addr + 4);
  *(long *)((long)data + 10) = lVar4;
  pbVar5 = (byte *)((long)data + 0x12);
  do {
    size = (int)lVar4 * 0xe + 0x12;
    while( true ) {
      pMVar1 = this->memberNode;
      if (__position._M_current ==
          (pMVar1->memberList).super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        *(long *)((long)data + 10) = lVar4;
        EmulNet::ENsend(this->emulNet,&pMVar1->addr,to,(char *)data,size);
        free(data);
        poVar3 = std::operator<<((ostream *)&std::cout,"...end sendMembershipList.");
        std::endl<char,std::char_traits<char>>(poVar3);
        return;
      }
      if (__position._M_current ==
          (pMVar1->memberList).super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>
          ._M_impl.super__Vector_impl_data._M_start) break;
      iVar2 = Params::getcurrtime(this->par);
      if ((long)iVar2 - (__position._M_current)->timestamp < 0x15) {
        iVar2 = Params::getcurrtime(this->par);
        if ((long)iVar2 - (__position._M_current)->timestamp < 6) break;
        __position._M_current = __position._M_current + 1;
      }
      else {
        toAddr.addr._0_4_ = (__position._M_current)->id;
        toAddr.addr._4_2_ = (__position._M_current)->port;
        Log::logNodeRemove(this->log,&this->memberNode->addr,&toAddr);
        __position = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::erase
                               (&this->memberNode->memberList,__position._M_current);
      }
      lVar4 = lVar4 + -1;
      size = size + -0xe;
    }
    *(int *)pbVar5 = (__position._M_current)->id;
    *(short *)(pbVar5 + 4) = (__position._M_current)->port;
    *(long *)(pbVar5 + 6) = (__position._M_current)->heartbeat;
    pbVar5 = pbVar5 + 0xe;
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void MP1Node::sendMembershipList(Address *to, enum MsgTypes msgType) {
    cout << "start sendMembershipList ..." << endl;

    long numberOfMembers = memberNode->memberList.size();
    //message structure: [MessageHdr] [Address] [Number of members] [Members...]
    size_t msgsize = sizeof(MessageHdr) + sizeof(memberNode->addr.addr) + sizeof(long) + (numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)));

    //malloc memory space for the header
    MessageHdr* msg = (MessageHdr *) malloc(msgsize * sizeof(char));

    //msg will be a pointer to an address
    char* data = (char*) (msg + 1);

    //set the message type
    msg->msgType = msgType;

    //set this node's address into the message
    memcpy(data, &memberNode->addr.addr, sizeof(memberNode->addr.addr));
    data += sizeof(memberNode->addr.addr);

    //set the number of members (for now)
    char* numberOfMembersPtr = data;
    memcpy(numberOfMembersPtr, &numberOfMembers, sizeof(long));
    data += sizeof(long);

    //set the members in list and delete members that have failed
    for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin(); entry != memberNode->memberList.end();) {
        if (entry != memberNode->memberList.begin()) {
            if (par->getcurrtime() - entry->timestamp > TREMOVE) {
#ifdef DEBUGLOG
                Address toAddr;
                memcpy(&toAddr.addr[0], &entry->id, sizeof(int));
                memcpy(&toAddr.addr[4], &entry->port, sizeof(short));
                log->logNodeRemove(&memberNode->addr, &toAddr);
#endif
                entry = memberNode->memberList.erase(entry);
                numberOfMembers--;
                continue;
            }
            //dont copy the failed not into the data
            if (par->getcurrtime() - entry->timestamp > TFAIL) {
                numberOfMembers--;
                ++entry;
                continue;
            }
        }

        memcpy(data, &entry->id, sizeof(int));
        data += sizeof(int);
        memcpy(data, &entry->port, sizeof(short));
        data += sizeof(short);
        memcpy(data, &entry->heartbeat, sizeof(long));
        data += sizeof(long);

        ++entry;
    }

    //set new number of members members were deleted
    memcpy(numberOfMembersPtr, &numberOfMembers, sizeof(long));

    //read new message size in case members were deleted
    msgsize = sizeof(MessageHdr) + sizeof(memberNode->addr.addr) + sizeof(long) + (numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)));

    //send membership list through network
    emulNet->ENsend(&memberNode->addr, to, (char *)msg, msgsize);   //send the membership list to network
    free(msg);

    cout << "...end sendMembershipList." << endl;
}